

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.cpp
# Opt level: O3

Vector3f pbrt::DNoise(Point3f p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Float FVar3;
  Float FVar4;
  Float FVar5;
  Float FVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [64];
  Float z;
  Float y;
  undefined1 auVar8 [16];
  Vector3f VVar9;
  
  z = p.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._8_56_ = p._8_56_;
  auVar7._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar2 = vmovshdup_avx(auVar7._0_16_);
  FVar6 = p.super_Tuple3<pbrt::Point3,_float>.x;
  y = auVar2._0_4_;
  FVar3 = Noise(FVar6,y,z);
  FVar4 = Noise(FVar6 + 0.01,y + 0.0,z + 0.0);
  FVar5 = Noise(FVar6 + 0.0,y + 0.01,z + 0.0);
  FVar6 = Noise(FVar6 + 0.0,y + 0.0,z + 0.01);
  auVar2._4_4_ = extraout_XMM0_Db;
  auVar2._0_4_ = FVar4;
  auVar2._8_4_ = extraout_XMM0_Dc;
  auVar2._12_4_ = extraout_XMM0_Dd;
  auVar8._4_4_ = FVar3;
  auVar8._0_4_ = FVar3;
  auVar8._8_4_ = FVar3;
  auVar8._12_4_ = FVar3;
  VVar9.super_Tuple3<pbrt::Vector3,_float>.z = (FVar6 - FVar3) / 0.01;
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)FVar5),0x10);
  auVar2 = vsubps_avx(auVar2,auVar8);
  auVar1._8_4_ = 0x3c23d70a;
  auVar1._0_8_ = 0x3c23d70a3c23d70a;
  auVar1._12_4_ = 0x3c23d70a;
  auVar2 = vdivps_avx512vl(auVar2,auVar1);
  VVar9.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar2._0_8_;
  return (Vector3f)VVar9.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f DNoise(Point3f p) {
    Float delta = .01f;
    Float n = Noise(p);
    Point3f noiseDelta(Noise(p + Vector3f(delta, 0, 0)), Noise(p + Vector3f(0, delta, 0)),
                       Noise(p + Vector3f(0, 0, delta)));
    return (noiseDelta - Point3f(n, n, n)) / delta;
}